

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_imp.h
# Opt level: O0

UBool icu_63::UTF8::isValidTrail(int32_t prev,uint8_t t,int32_t i,int32_t length)

{
  int32_t length_local;
  int32_t i_local;
  uint8_t t_local;
  int32_t prev_local;
  
  if ((length < 3) || (1 < i)) {
    t_local = (char)t < -0x40;
  }
  else if (length == 3) {
    t_local = " 000000000000\x1000"[(int)(prev & 0xf)] & (byte)(1 << (sbyte)((int)(uint)t >> 5));
  }
  else {
    t_local = ""[(int)(uint)t >> 4] & (byte)(1 << ((byte)prev & 7));
  }
  return t_local;
}

Assistant:

static inline UBool isValidTrail(int32_t prev, uint8_t t, int32_t i, int32_t length) {
        // The first trail byte after a 3- or 4-byte lead byte
        // needs to be validated together with its lead byte.
        if (length <= 2 || i > 1) {
            return U8_IS_TRAIL(t);
        } else if (length == 3) {
            return U8_IS_VALID_LEAD3_AND_T1(prev, t);
        } else {  // length == 4
            return U8_IS_VALID_LEAD4_AND_T1(prev, t);
        }
    }